

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::perform_dwarf_fission_resolution
          (dwarf_resolver *this,die_object *cu_die,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
          *dwo_name,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  long *plVar1;
  pointer psVar2;
  pointer psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  cache_mode cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  _Var8;
  Dwarf_Debug this_00;
  int __flags;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  void *__child_stack;
  void *__child_stack_00;
  stacktrace_frame *__arg;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false,_false>,_bool>
  pVar10;
  source_location location;
  source_location location_00;
  Dwarf_Half dwversion;
  Dwarf_Half offset_size;
  __string_type __str;
  string path;
  Dwarf_Off off;
  dwarf_resolver resolver;
  char *in_stack_fffffffffffffc78;
  Dwarf_Half local_37a;
  object_frame *local_378;
  Dwarf_Half local_36a;
  undefined1 local_368 [32];
  undefined8 local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  bool local_310;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  anon_union_32_2_d41c7fdf_for_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>_2
  local_2d0;
  bool local_2b0;
  undefined1 local_2a8 [22];
  undefined2 uStack_292;
  undefined1 local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  bool local_250;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_248;
  anon_union_32_2_d41c7fdf_for_optional<cpptrace::detail::libdwarf::skeleton_info,_0>_2 local_228;
  char local_208;
  anon_union_32_2_d41c7fdf_for_optional<cpptrace::detail::libdwarf::skeleton_info,_0>_2 local_1f8;
  char local_1d8;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_1c8;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_148 [11];
  
  if (dwo_name->holds_value != true) {
    return;
  }
  __arg = frame;
  die_object::get_string_attribute_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              *)&local_2d0,cu_die,0x1b);
  local_36a = 0;
  local_37a = 0;
  dwarf_get_version_of_die(cu_die->die,&local_37a,&local_36a);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_string_length = 0;
  local_2f0.field_2._M_local_buf[0] = '\0';
  if (dwo_name->holds_value == false) {
    location._8_8_ = "Optional does not contain a value";
    location.file = (char *)0x130;
    assert_fail((detail *)0x0,0x18f2f4,
                "const T &cpptrace::detail::optional<std::basic_string<char>>::unwrap() const & [T = std::basic_string<char>]"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/utils/utils.hpp"
                ,location,in_stack_fffffffffffffc78);
  }
  if (((dwo_name->field_0).uvalue._M_string_length == 0) || (**(char **)&dwo_name->field_0 != '/'))
  {
    if (local_2b0 != true) goto LAB_0013c993;
    local_368._0_8_ = local_368 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_368,local_2d0.uvalue._M_dataplus._M_p,
               (pointer)(local_2d0.uvalue._M_string_length + (long)local_2d0.uvalue._M_dataplus._M_p
                        ));
    __arg = (stacktrace_frame *)0x2f;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
               local_368._8_8_,0,1,'/');
    if (dwo_name->holds_value == false) {
      location_00._8_8_ = "Optional does not contain a value";
      location_00.file = (char *)0x130;
      assert_fail((detail *)0x0,0x18f2f4,
                  "const T &cpptrace::detail::optional<std::basic_string<char>>::unwrap() const & [T = std::basic_string<char>]"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/utils/utils.hpp"
                  ,location_00,in_stack_fffffffffffffc78);
    }
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368,(dwo_name->field_0).uvalue._M_dataplus._M_p,
                       (dwo_name->field_0).uvalue._M_string_length);
    local_1a8._0_8_ = (pbVar7->_M_dataplus)._M_p;
    paVar9 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ == paVar9) {
      local_1a8._16_8_ = paVar9->_M_allocated_capacity;
      aStack_190._M_allocated_capacity = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_1a8._0_8_ = local_1a8 + 0x10;
    }
    else {
      local_1a8._16_8_ = paVar9->_M_allocated_capacity;
    }
    local_1a8._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    local_378 = (object_frame *)inlines;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_2f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    inlines = (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
              local_378;
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
      inlines = (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
                local_378;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_2f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dwo_name);
  }
  local_368._24_8_ = &local_340;
  local_348 = 0;
  local_340._M_local_buf[0] = '\0';
  paVar9 = &local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_308.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_330._M_dataplus._M_p = (pointer)paVar9;
  cVar6 = get_cache_mode();
  __flags = (int)paVar9;
  if (cVar6 == prioritize_memory) {
    die_object::clone((die_object *)local_2a8,(__fn *)cu_die,__child_stack,__flags,__arg);
    psVar2 = stack0xfffffffffffffd68;
    stack0xfffffffffffffd68 = (pointer)CONCAT62(stack0xfffffffffffffd6a,local_37a);
    psVar3 = stack0xfffffffffffffd68;
    local_1d8 = '\x01';
    local_1f8.uvalue.cu_die.dbg = (Dwarf_Debug)local_2a8._0_8_;
    local_1f8.uvalue.cu_die.die = (Dwarf_Die)local_2a8._8_8_;
    local_2a8._0_8_ = (Dwarf_Debug)0x0;
    local_2a8._8_8_ = (pointer)0x0;
    local_1f8.uvalue.dwversion = local_37a;
    local_2a8._18_4_ = SUB84(psVar2,2);
    local_1f8._18_4_ = local_2a8._18_4_;
    uStack_292 = SUB82(psVar2,6);
    local_1f8._22_2_ = uStack_292;
    unique0x10000e0f = psVar3;
    local_290._0_8_ = this;
    local_1f8.uvalue.resolver = this;
    dwarf_resolver((dwarf_resolver *)local_1a8,&local_2f0,
                   (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_1f8.uvalue);
    if (local_1d8 == '\x01') {
      die_object::~die_object(&local_1f8.uvalue.cu_die);
    }
    local_1d8 = 0;
    die_object::~die_object((die_object *)local_2a8);
    resolve_frame((frame_with_inlines *)local_2a8,(dwarf_resolver *)local_1a8,object_frame_info);
    local_368._16_8_ = stack0xfffffffffffffd68;
    local_368._0_8_ = local_2a8._0_8_;
    local_368._8_8_ = local_2a8._8_8_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_368 + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_330,&local_270);
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_308.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_308.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_308.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_310 = local_250;
    local_308.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_248.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_308.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_248.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_308.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_248.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (&local_1c8);
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((dwarf_resolver *)local_290._0_8_ != (dwarf_resolver *)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    ~dwarf_resolver((dwarf_resolver *)local_1a8);
  }
  else {
    local_378 = object_frame_info;
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)die_object::get_global_offset(cu_die);
    _Var8._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->split_full_cu_resolvers)._M_h,(key_type *)&local_1c8);
    if (_Var8._M_cur == (__node_type *)0x0) {
      this_00 = (Dwarf_Debug)operator_new(0x170);
      die_object::clone((die_object *)local_1a8,(__fn *)cu_die,__child_stack_00,__flags,__arg);
      uVar4 = local_1a8._16_8_;
      local_1a8._16_2_ = local_37a;
      uVar5 = local_1a8._16_8_;
      local_208 = '\x01';
      local_228.uvalue.cu_die.dbg = (Dwarf_Debug)local_1a8._0_8_;
      local_228.uvalue.cu_die.die = (Dwarf_Die)local_1a8._8_8_;
      local_1a8._0_8_ = (pointer)0x0;
      local_1a8._8_8_ = (pointer)0x0;
      local_228.uvalue.dwversion = local_37a;
      local_1a8._18_4_ = SUB84(uVar4,2);
      local_228._18_4_ = local_1a8._18_4_;
      local_1a8._22_2_ = SUB82(uVar4,6);
      local_228._22_2_ = local_1a8._22_2_;
      local_228.uvalue.resolver = this;
      local_1a8._16_8_ = uVar5;
      aStack_190._M_allocated_capacity = (size_type)this;
      dwarf_resolver((dwarf_resolver *)this_00,&local_2f0,
                     (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_228.uvalue);
      local_2a8._0_8_ = this_00;
      pVar10 = std::
               _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<unsigned_long_long&,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>
                         ((_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->split_full_cu_resolvers,&local_1c8);
      _Var8._M_cur = (__node_type *)
                     pVar10.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
                     ._M_cur;
      if ((Dwarf_Debug)local_2a8._0_8_ != (Dwarf_Debug)0x0) {
        (*((symbol_resolver *)local_2a8._0_8_)->_vptr_symbol_resolver[1])();
      }
      local_2a8._0_8_ = (Dwarf_Debug)0x0;
      if (local_208 == '\x01') {
        die_object::~die_object(&local_228.uvalue.cu_die);
      }
      local_208 = 0;
      die_object::~die_object((die_object *)local_1a8);
    }
    plVar1 = *(long **)((long)&((_Var8._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>
                               ._M_storage._M_storage + 8);
    (**(code **)(*plVar1 + 0x10))(local_1a8,plVar1,local_378);
    local_368._16_8_ = local_1a8._16_8_;
    local_368._0_8_ = local_1a8._0_8_;
    local_368._8_8_ = local_1a8._8_8_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_368 + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aStack_190);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_330,&local_170);
    unique0x10000da7 =
         local_308.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2a8._8_8_ =
         local_308.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2a8._0_8_ =
         local_308.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_310 = (bool)local_150;
    local_308.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_148[0].
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_308.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_148[0].
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_308.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_148[0].
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_148[0].
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148[0].
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148[0].
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
               local_2a8);
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aStack_190._0_8_ != &local_180) {
      operator_delete((void *)aStack_190._0_8_,local_180._M_allocated_capacity + 1);
    }
  }
  frame->line = (nullable<unsigned_int,_0>)local_368._16_4_;
  frame->column = (nullable<unsigned_int,_0>)local_368._20_4_;
  frame->raw_address = local_368._0_8_;
  frame->object_address = local_368._8_8_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&frame->filename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_368 + 0x18)
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&frame->symbol,&local_330);
  frame->is_inline = local_310;
  local_1a8._16_8_ = (((object_frame *)inlines)->object_path)._M_dataplus._M_p;
  (((object_frame *)inlines)->object_path)._M_dataplus._M_p =
       (pointer)local_308.
                super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1a8._0_8_ = ((object_frame *)inlines)->raw_address;
  local_1a8._8_8_ = ((object_frame *)inlines)->object_address;
  ((object_frame *)inlines)->raw_address =
       (frame_ptr)
       local_308.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ((object_frame *)inlines)->object_address =
       (frame_ptr)
       local_308.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_308.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             local_1a8);
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            (&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                             local_330.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._24_8_ != &local_340) {
    operator_delete((void *)local_368._24_8_,
                    CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                             local_2f0.field_2._M_local_buf[0]) + 1);
  }
LAB_0013c993:
  if ((local_2b0 == true) &&
     (local_2d0.uvalue._M_dataplus._M_p != (_Alloc_hider)((long)&local_2d0.uvalue + 0x10))) {
    operator_delete((void *)local_2d0.uvalue._M_dataplus._M_p,local_2d0._16_8_ + 1);
  }
  return;
}

Assistant:

void perform_dwarf_fission_resolution(
            const die_object& cu_die,
            const optional<std::string>& dwo_name,
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            // Split dwarf / debug fission / dwo is handled here
            // Location of the split full CU is a combination of DW_AT_dwo_name/DW_AT_GNU_dwo_name and DW_AT_comp_dir
            // https://gcc.gnu.org/wiki/DebugFission
            if(dwo_name) {
                // TODO: DWO ID?
                auto comp_dir = cu_die.get_string_attribute(DW_AT_comp_dir);
                Dwarf_Half offset_size = 0;
                Dwarf_Half dwversion = 0;
                dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                std::string path;
                if(is_absolute(dwo_name.unwrap())) {
                    path = dwo_name.unwrap();
                } else if(comp_dir) {
                    path = comp_dir.unwrap() + PATH_SEP + dwo_name.unwrap();
                } else {
                    // maybe default to dwo_name but for now not doing anything
                    return;
                }
                // todo: slight inefficiency in this copy-back strategy due to other frame members
                frame_with_inlines res;
                if(get_cache_mode() == cache_mode::prioritize_memory) {
                    dwarf_resolver resolver(
                        path,
                        skeleton_info{cu_die.clone(), dwversion, *this}
                    );
                    res = resolver.resolve_frame(object_frame_info);
                } else {
                    auto off = cu_die.get_global_offset();
                    auto it = split_full_cu_resolvers.find(off);
                    if(it == split_full_cu_resolvers.end()) {
                        it = split_full_cu_resolvers.emplace(
                            off,
                            std::unique_ptr<dwarf_resolver>(
                                new dwarf_resolver(
                                    path,
                                    skeleton_info{cu_die.clone(), dwversion, *this}
                                )
                            )
                        ).first;
                    }
                    res = it->second->resolve_frame(object_frame_info);
                }
                frame = std::move(res.frame);
                inlines = std::move(res.inlines);
            }
        }